

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall helics::CommonCore::generateFilterFederate(CommonCore *this)

{
  GlobalFederateId fedID;
  pointer pcVar1;
  _Alloc_hider __src;
  route_id rVar2;
  FilterFederate *pFVar3;
  pthread_t pVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  _Any_data local_1c8;
  code *local_1b8;
  code *pcStack_1b0;
  _Any_data local_1a8;
  code *local_198;
  code *pcStack_190;
  _Any_data local_188;
  code *local_178;
  code *pcStack_170;
  _Any_data local_168;
  code *local_158;
  code *pcStack_150;
  _Any_data local_148;
  code *local_138;
  code *pcStack_130;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  _Any_data local_108;
  code *local_f8;
  code *pcStack_f0;
  ActionMessage local_e0;
  
  fedID.gid = (this->filterFedID)._M_i.gid;
  pFVar3 = (FilterFederate *)operator_new(0x4c0);
  pcVar1 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar1,
             pcVar1 + (this->super_BrokerBase).identifier._M_string_length);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_1e8,"_filters");
  FilterFederate::FilterFederate
            (pFVar3,fedID,(string *)&local_1e8,
             (GlobalBrokerId)(this->super_BrokerBase).global_broker_id_local.gid,&this->super_Core);
  this->filterFed = pFVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  pVar4 = pthread_self();
  LOCK();
  (this->filterThread)._M_i._M_thread = pVar4;
  UNLOCK();
  LOCK();
  (this->filterFedID)._M_i.gid = fedID.gid;
  UNLOCK();
  local_188._8_8_ = 0;
  pcStack_170 = std::
                _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3887:29)>
                ::_M_invoke;
  local_178 = std::
              _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3887:29)>
              ::_M_manager;
  local_1a8._8_8_ = 0;
  pcStack_190 = std::
                _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3888:29)>
                ::_M_invoke;
  local_198 = std::
              _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3888:29)>
              ::_M_manager;
  local_1c8._8_8_ = 0;
  pcStack_1b0 = std::
                _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3891:29)>
                ::_M_invoke;
  local_1b8 = std::
              _Function_handler<void_(const_helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3891:29)>
              ::_M_manager;
  local_108._8_8_ = 0;
  pcStack_f0 = std::
               _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3892:29)>
               ::_M_invoke;
  local_f8 = std::
             _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3892:29)>
             ::_M_manager;
  local_1c8._M_unused._M_object = this;
  local_1a8._M_unused._M_object = this;
  local_188._M_unused._M_object = this;
  local_108._M_unused._M_object = this;
  FilterFederate::setCallbacks
            (this->filterFed,(function<void_(const_helics::ActionMessage_&)> *)&local_188,
             (function<void_(helics::ActionMessage_&&)> *)&local_1a8,
             (function<void_(const_helics::ActionMessage_&)> *)&local_1c8,
             (function<void_(helics::ActionMessage_&&)> *)&local_108);
  if (local_f8 != (code *)0x0) {
    (*local_f8)((_Any_data *)&local_108,(_Any_data *)&local_108,__destroy_functor);
  }
  if (local_1b8 != (code *)0x0) {
    (*local_1b8)((_Any_data *)&local_1c8,(_Any_data *)&local_1c8,__destroy_functor);
  }
  if (local_198 != (code *)0x0) {
    (*local_198)((_Any_data *)&local_1a8,(_Any_data *)&local_1a8,__destroy_functor);
  }
  if (local_178 != (code *)0x0) {
    (*local_178)((_Any_data *)&local_188,(_Any_data *)&local_188,__destroy_functor);
  }
  (this->super_BrokerBase).hasFilters = true;
  pFVar3 = this->filterFed;
  pFVar3->mHandles = &this->loopHandles;
  local_128._8_8_ = 0;
  pcStack_110 = std::
                _Function_handler<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3896:26)>
                ::_M_invoke;
  local_118 = std::
              _Function_handler<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3896:26)>
              ::_M_manager;
  local_128._M_unused._M_object = this;
  std::
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::operator=(&pFVar3->mLogger,
              (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *)&local_128);
  if (local_118 != (code *)0x0) {
    (*local_118)((_Any_data *)&local_128,(_Any_data *)&local_128,__destroy_functor);
  }
  local_148._8_8_ = 0;
  pcStack_130 = std::
                _Function_handler<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3899:35)>
                ::_M_invoke;
  local_138 = std::
              _Function_handler<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3899:35)>
              ::_M_manager;
  local_148._M_unused._M_object = this;
  std::function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>::
  operator=(&this->filterFed->mGetAirLock,
            (function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>
             *)&local_148);
  if (local_138 != (code *)0x0) {
    (*local_138)((_Any_data *)&local_148,(_Any_data *)&local_148,__destroy_functor);
  }
  local_168._8_8_ = 0;
  pcStack_150 = std::
                _Function_handler<void_(helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3900:27)>
                ::_M_invoke;
  local_158 = std::
              _Function_handler<void_(helics::ActionMessage_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CommonCore.cpp:3900:27)>
              ::_M_manager;
  local_168._M_unused._M_object = this;
  std::function<void_(helics::ActionMessage_&)>::operator=
            (&this->filterFed->mDeliverMessage,
             (function<void_(helics::ActionMessage_&)> *)&local_168);
  if (local_158 != (code *)0x0) {
    (*local_158)((_Any_data *)&local_168,(_Any_data *)&local_168,__destroy_functor);
  }
  ActionMessage::ActionMessage(&local_e0,cmd_reg_fed);
  local_e0.flags._1_1_ = local_e0.flags._1_1_ | 0xc0;
  local_e0.dest_id.gid = 0;
  local_e0.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
  pcVar1 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  local_e0.dest_handle.hid = fedID.gid;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,pcVar1,
             pcVar1 + (this->super_BrokerBase).identifier._M_string_length);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_208,"_filters");
  __src._M_p = local_208._M_dataplus._M_p;
  if (local_e0.payload.heap == (byte *)local_208._M_dataplus._M_p) {
    local_e0.payload.bufferSize = local_208._M_string_length;
  }
  else {
    SmallBuffer::reserve(&local_e0.payload,local_208._M_string_length);
    local_e0.payload.bufferSize = local_208._M_string_length;
    if (local_208._M_string_length != 0) {
      memcpy(local_e0.payload.heap,__src._M_p,local_208._M_string_length);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  rVar2 = getRoute(this,(GlobalFederateId)(this->super_BrokerBase).higher_broker_id.gid);
  (*(this->super_Core)._vptr_Core[0x6b])(this,(ulong)(uint)rVar2.rid,&local_e0);
  if ((this->super_BrokerBase).globalTime == true) {
    pFVar3 = this->filterFed;
    pFVar3->usingGlobalTime = true;
    (pFVar3->mCoord).globalTime = true;
  }
  ActionMessage::~ActionMessage(&local_e0);
  return;
}

Assistant:

void CommonCore::generateFilterFederate()
{
    auto fid = filterFedID.load();

    filterFed = new FilterFederate(fid, getIdentifier() + "_filters", global_broker_id_local, this);
    filterThread.store(std::this_thread::get_id());
    filterFedID.store(fid);

    filterFed->setCallbacks([this](const ActionMessage& message) { addActionMessage(message); },
                            [this](ActionMessage&& message) {
                                addActionMessage(std::move(message));
                            },
                            [this](const ActionMessage& message) { routeMessage(message); },
                            [this](ActionMessage&& message) { routeMessage(std::move(message)); });
    hasFilters = true;

    filterFed->setHandleManager(&loopHandles);
    filterFed->setLogger([this](int level, std::string_view name, std::string_view message) {
        sendToLogger(global_broker_id_local, level, name, message);
    });
    filterFed->setAirLockFunction([this](int index) { return std::ref(dataAirlocks[index]); });
    filterFed->setDeliver([this](ActionMessage& message) { deliverMessage(message); });
    ActionMessage newFed(CMD_REG_FED);
    setActionFlag(newFed, child_flag);
    setActionFlag(newFed, non_counting_flag);
    newFed.dest_id = parent_broker_id;
    newFed.source_id = global_broker_id_local;
    newFed.setExtraData(fid.baseValue());
    newFed.name(getIdentifier() + "_filters");
    transmit(getRoute(higher_broker_id), newFed);
    if (globalTime) {
        filterFed->useGlobalTimeCoordinator(true);
    }
}